

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufferDump(FILE *file,xmlBufferPtr buf)

{
  size_t local_30;
  size_t ret;
  xmlBufferPtr buf_local;
  FILE *file_local;
  
  if (buf == (xmlBufferPtr)0x0) {
    file_local._4_4_ = 0;
  }
  else if (buf->content == (xmlChar *)0x0) {
    file_local._4_4_ = 0;
  }
  else {
    buf_local = (xmlBufferPtr)file;
    if (file == (FILE *)0x0) {
      buf_local = _stdout;
    }
    local_30 = fwrite(buf->content,1,(ulong)buf->use,(FILE *)buf_local);
    if (0x7fffffff < local_30) {
      local_30 = 0x7fffffff;
    }
    file_local._4_4_ = (int)local_30;
  }
  return file_local._4_4_;
}

Assistant:

int
xmlBufferDump(FILE *file, xmlBufferPtr buf) {
    size_t ret;

    if (buf == NULL)
	return(0);
    if (buf->content == NULL)
	return(0);
    if (file == NULL)
	file = stdout;
    ret = fwrite(buf->content, 1, buf->use, file);
    return(ret > INT_MAX ? INT_MAX : ret);
}